

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

uint64_t __thiscall pbrt::ZSobolSampler::GetSampleIndex(ZSobolSampler *this)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  iVar7 = this->nBase4Digits;
  uVar6 = 0;
  uVar4 = this->log2SamplesPerPixel & 1;
  uVar3 = (ulong)(uint)(iVar7 * 2);
  for (; (int)uVar4 < iVar7; iVar7 = iVar7 + -1) {
    uVar1 = this->mortonIndex;
    uVar5 = (ulong)((int)uVar3 - 2);
    iVar2 = HashPerm(this,uVar1 >> (uVar3 & 0x3f));
    uVar6 = uVar6 | (ulong)GetSampleIndex::permutations[iVar2][(uint)(uVar1 >> (uVar5 & 0x3f)) & 3]
                    << (uVar5 & 0x3f);
    uVar3 = uVar5;
  }
  uVar3 = ((uint)this->mortonIndex & 2 | uVar6) >> 1;
  if (uVar4 == 0) {
    uVar3 = uVar6;
  }
  return uVar3;
}

Assistant:

PBRT_CPU_GPU
    uint64_t GetSampleIndex() const {
        static const uint8_t permutations[24][4] = {
            {0, 1, 2, 3}, {0, 1, 3, 2}, {0, 2, 1, 3}, {0, 2, 3, 1}, {0, 3, 2, 1},
            {0, 3, 1, 2}, {1, 0, 2, 3}, {1, 0, 3, 2}, {1, 2, 0, 3}, {1, 2, 3, 0},
            {1, 3, 2, 0}, {1, 3, 0, 2}, {2, 1, 0, 3}, {2, 1, 3, 0}, {2, 0, 1, 3},
            {2, 0, 3, 1}, {2, 3, 0, 1}, {2, 3, 1, 0}, {3, 1, 2, 0}, {3, 1, 0, 2},
            {3, 2, 1, 0}, {3, 2, 0, 1}, {3, 0, 2, 1}, {3, 0, 1, 2}};

        uint64_t sampleIndex = 0;
        bool pow2Samples = log2SamplesPerPixel & 1;
        int lastDigit = pow2Samples ? 1 : 0;
        for (int i = nBase4Digits - 1; i >= lastDigit; --i) {
            int digitShift = 2 * i;
            int digit = (mortonIndex >> digitShift) & 3;
            int p = HashPerm(mortonIndex >> (digitShift + 2));
            digit = permutations[p][digit];
            sampleIndex |= uint64_t(digit) << digitShift;
        }
        if (pow2Samples) {
            sampleIndex |= (mortonIndex & 3);
            sampleIndex >>= 1;
        }
        return sampleIndex;
    }